

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O2

void __thiscall
SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows2_Test::TestBody
          (SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows2_Test *this)

{
  string source;
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "\n  fn main(): f32\n  {\n    let x: function = 12;\n    ret 0;\n  }\n  ",&local_29);
  throwTest(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableDeclarationTypeMismatchThrows2)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    let x: function = 12;
    ret 0;
  }
  )SRC";
  throwTest(source);
}